

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::VerifyCacheIdToPropertyIdMap(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  uVar3 = GetCountField(this,InlineCacheCount);
  if (uVar3 != 0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar5 = 0;
    do {
      if ((this->cacheIdToPropertyIdMap).ptr[uVar5] == -1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x10a7,
                                    "(this->cacheIdToPropertyIdMap[i] != Js::Constants::NoProperty)"
                                    ,"this->cacheIdToPropertyIdMap[i] != Js::Constants::NoProperty")
        ;
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

void FunctionBody::VerifyCacheIdToPropertyIdMap()
    {
        uint count = this->GetInlineCacheCount();
        for (uint i = 0; i < count; i++)
        {
            Assert(this->cacheIdToPropertyIdMap[i] != Js::Constants::NoProperty);
        }
    }